

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateWindowMode(_GLFWwindow *window)

{
  long in_RDI;
  XSetWindowAttributes attributes_1;
  unsigned_long value;
  XSetWindowAttributes attributes;
  undefined1 local_f0 [88];
  undefined4 local_98;
  undefined8 local_80;
  undefined1 local_78 [48];
  long in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  long in_stack_ffffffffffffffd0;
  Atom in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  long in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    if ((_glfw.x11.xinerama.available != 0) && (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0)) {
      XDeleteProperty(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x350),
                      _glfw.x11.NET_WM_FULLSCREEN_MONITORS);
    }
    if ((_glfw.x11.NET_WM_STATE == 0) || (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0)) {
      local_98 = 0;
      XChangeWindowAttributes(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x350),0x200,local_f0);
      *(undefined4 *)(in_RDI + 0x368) = 0;
    }
    else {
      sendEventToWM((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_fffffffffffffff0);
    }
    if (*(int *)(in_RDI + 0x374) == 0) {
      XDeleteProperty(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x350),
                      _glfw.x11.NET_WM_BYPASS_COMPOSITOR);
    }
  }
  else {
    if ((_glfw.x11.xinerama.available != 0) && (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0)) {
      sendEventToWM((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_fffffffffffffff0);
    }
    if ((_glfw.x11.NET_WM_STATE == 0) || (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0)) {
      XChangeWindowAttributes(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x350),0x200,local_78);
      *(undefined4 *)(in_RDI + 0x368) = 1;
    }
    else {
      sendEventToWM((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_fffffffffffffff0);
    }
    if (*(int *)(in_RDI + 0x374) == 0) {
      local_80 = 1;
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x350),
                      _glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20,0,&local_80,1);
    }
  }
  return;
}

Assistant:

static void updateWindowMode(_GLFWwindow* window)
{
    if (window->monitor)
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          0);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_ADD,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            // This is the butcher's way of removing window decorations
            // Setting the override-redirect attribute on a window makes the
            // window manager ignore the window completely (ICCCM, section 4)
            // The good thing is that this makes undecorated full screen windows
            // easy to do; the bad thing is that we have to do everything
            // manually and some things (like iconify/restore) won't work at
            // all, as those are tasks usually performed by the window manager

            XSetWindowAttributes attributes;
            attributes.override_redirect = True;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_TRUE;
        }

        // Enable compositor bypass
        if (!window->x11.transparent)
        {
            const unsigned long value = 1;

            XChangeProperty(_glfw.x11.display,  window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                            PropModeReplace, (unsigned char*) &value, 1);
        }
    }
    else
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_FULLSCREEN_MONITORS);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_REMOVE,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            XSetWindowAttributes attributes;
            attributes.override_redirect = False;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_FALSE;
        }

        // Disable compositor bypass
        if (!window->x11.transparent)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR);
        }
    }
}